

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void helper_sve_rev_s_aarch64(void *vd,void *vn,uint32_t desc)

{
  intptr_t iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t b;
  uint64_t f;
  intptr_t opr_sz;
  intptr_t j;
  intptr_t i;
  uint32_t desc_local;
  void *vn_local;
  void *vd_local;
  
  iVar1 = simd_oprsz(desc);
  opr_sz = iVar1;
  for (j = 0; opr_sz = opr_sz + -8, j < iVar1 / 2; j = j + 8) {
    uVar3 = *(uint64_t *)((long)vn + j);
    uVar2 = rol64(*(uint64_t *)((long)vn + opr_sz),0x20);
    *(uint64_t *)((long)vd + j) = uVar2;
    uVar3 = rol64(uVar3,0x20);
    *(uint64_t *)((long)vd + opr_sz) = uVar3;
  }
  return;
}

Assistant:

void HELPER(sve_rev_s)(void *vd, void *vn, uint32_t desc)
{
    intptr_t i, j, opr_sz = simd_oprsz(desc);
    for (i = 0, j = opr_sz - 8; i < opr_sz / 2; i += 8, j -= 8) {
        uint64_t f = *(uint64_t *)((char *)vn + i);
        uint64_t b = *(uint64_t *)((char *)vn + j);
        *(uint64_t *)((char *)vd + i) = rol64(b, 32);
        *(uint64_t *)((char *)vd + j) = rol64(f, 32);
    }
}